

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Data_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Data_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pKVar4;
  pointer pKVar5;
  KStringStream ss;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_1d8,(Header7 *)this);
  poVar3 = std::operator<<(local_1a8,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"-Data PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f8,(Simulation_Management_Header *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"Request ID:            ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\nNumber Fixed Datum:    ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\nNumber Variable Datum: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::operator<<(local_1a8,"Fixed Datum\n");
  pKVar1 = (this->super_Comment_PDU).m_vFixedDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->super_Comment_PDU).m_vFixedDatum.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
    (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_1f8);
    UTILS::IndentString(&local_1d8,&local_1f8,Tabs,in_CL);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::operator<<(local_1a8,"Variable Datum\n");
  pKVar2 = (this->super_Comment_PDU).m_vVariableDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar5 = (this->super_Comment_PDU).m_vVariableDatum.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar5 != pKVar2; pKVar5 = pKVar5 + 1) {
    (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_1f8);
    UTILS::IndentString(&local_1d8,&local_1f8,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Request ID:            "   << m_ui32RequestID
       << "\nNumber Fixed Datum:    " << m_ui32NumFixedDatum
       << "\nNumber Variable Datum: " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum\n";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datum\n";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}